

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline_int8_x86(Convolution_x86_avx512 *this,Option *opt)

{
  float fVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  float *pfVar8;
  void *pvVar9;
  int *piVar10;
  Allocator *pAVar11;
  int max_ii;
  bool bVar12;
  int k_5;
  uint _h;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  short *psVar24;
  void *pvVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  int k_1;
  int i_00;
  long lVar31;
  ulong uVar32;
  long lVar33;
  int i;
  uint uVar34;
  int k_10;
  int max_kk;
  short *psVar35;
  char *pcVar36;
  undefined1 (*pauVar37) [16];
  int m_1;
  long lVar38;
  long lVar39;
  long lVar40;
  undefined8 *puVar41;
  long lVar42;
  long lVar43;
  int k;
  int k_11;
  ulong uVar44;
  long lVar45;
  int iVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  float fVar94;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  size_t sStackY_2e0;
  long local_2b8;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  uint local_264;
  int local_260;
  int local_25c;
  int TILE_N;
  ulong local_230;
  long local_228;
  long local_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  Mat m;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  Mat local_1a8;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  long local_148;
  long local_140;
  Mat *local_138;
  int TILE_M;
  int TILE_M_2;
  short asStack_124 [2];
  undefined8 local_120;
  undefined8 local_118;
  int local_110;
  short sStack_10a;
  Allocator *local_108;
  int local_100;
  int local_fc;
  int local_f8;
  undefined8 local_f4;
  size_t local_e8;
  long local_d8;
  int local_cc;
  uint local_c8;
  int TILE_K;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  undefined1 local_78 [64];
  
  uVar47._0_4_ = (this->super_Convolution).kernel_w;
  uVar47._4_4_ = (this->super_Convolution).kernel_h;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar47;
  auVar55 = vpshufd_avx(auVar56,0x55);
  auVar55 = vpmulld_avx(auVar55,auVar56);
  uVar14 = auVar55._0_4_;
  uVar29 = (long)(this->super_Convolution).weight_data_size / (long)(int)uVar14;
  uVar19 = (this->super_Convolution).num_output;
  uVar20 = (ulong)(int)uVar19;
  uVar29 = (long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 | uVar29 & 0xffffffff) /
           (long)(int)uVar19;
  _h = (uint)uVar29;
  uVar44 = uVar29 & 0xffffffff;
  if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
    bVar12 = false;
  }
  else {
    bVar12 = 8 < (int)uVar19 || 8 < (int)_h;
  }
  auVar55._0_4_ = (this->super_Convolution).dilation_w;
  auVar55._4_4_ = (this->super_Convolution).dilation_h;
  auVar55._8_4_ = (this->super_Convolution).stride_w;
  auVar55._12_4_ = (this->super_Convolution).stride_h;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar47;
  auVar55 = vpunpcklqdq_avx(auVar57,auVar55);
  local_138 = &(this->super_Convolution).weight_data;
  lVar21 = (long)(int)_h;
  if ((((auVar55 == _DAT_00538100) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar12)))) {
    if (opt->use_winograd43_convolution == true) {
      get_optimal_tile_mnk_int8(uVar19,0,_h,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      uVar47 = (long)(int)((uVar19 - 1) + TILE_M) / (long)TILE_M;
      local_1a8.cstep = 0;
      local_1a8.data = (void *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize = 0;
      local_1a8.elempack = 0;
      local_1a8.allocator = (Allocator *)0x0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
      Mat::create(&local_1a8,TILE_K * TILE_M * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
      iVar13 = (int)uVar47;
      Mat::create(&this->weight_winograd43_data,TILE_K * TILE_M,0x24,
                  (int)(_h + TILE_K + -1) / TILE_K,iVar13,4,(Allocator *)0x0);
      uVar47 = uVar47 & 0xffffffff;
      if (iVar13 < 1) {
        uVar47 = 0;
      }
      for (uVar29 = 0; uVar29 != uVar47; uVar29 = uVar29 + 1) {
        iVar13 = get_omp_thread_num();
        psVar35 = (short *)((long)iVar13 * local_1a8.cstep * local_1a8.elemsize +
                           (long)local_1a8.data);
        m.refcount = (int *)0x0;
        m.elemsize = local_1a8.elemsize;
        m.elempack = local_1a8.elempack;
        m.allocator = local_1a8.allocator;
        m.w = local_1a8.w;
        m.d = 1;
        m.h = local_1a8.h;
        m.c = local_1a8.d;
        m.dims = local_1a8.dims + -1;
        m.cstep = (local_1a8.elemsize * (long)local_1a8.h * (long)local_1a8.w + 0xf &
                  0xfffffffffffffff0) / local_1a8.elemsize;
        if (local_1a8.dims == 4) {
          m.cstep = (long)local_1a8.h * (long)local_1a8.w;
        }
        iVar13 = (int)uVar29 * TILE_M;
        uVar14 = uVar19 - iVar13;
        if (TILE_M < (int)uVar14) {
          uVar14 = TILE_M;
        }
        local_78._0_4_ = uVar14;
        uVar20 = 0;
        if (0 < (int)uVar14) {
          uVar20 = (ulong)uVar14;
        }
        m.data = psVar35;
        for (uVar44 = 0; (long)uVar44 < lVar21; uVar44 = uVar44 + (long)TILE_K) {
          uVar14 = _h - (int)uVar44;
          if (TILE_K < (int)uVar14) {
            uVar14 = TILE_K;
          }
          uVar17 = 0;
          if (0 < (int)uVar14) {
            uVar17 = (ulong)uVar14;
          }
          psVar24 = psVar35;
          for (uVar22 = 0; uVar22 != uVar20; uVar22 = uVar22 + 1) {
            pvVar25 = local_138->data;
            for (uVar32 = 0; uVar32 != uVar17; uVar32 = uVar32 + 1) {
              pcVar36 = (char *)((long)pvVar25 +
                                (uVar32 + uVar44) * 9 + (long)(int)((iVar13 + (int)uVar22) * _h * 9)
                                );
              for (lVar38 = 0; lVar38 != 3; lVar38 = lVar38 + 1) {
                cVar2 = *pcVar36;
                cVar3 = pcVar36[1];
                cVar4 = pcVar36[2];
                asStack_124[lVar38 + -2] = cVar2 * 6;
                asStack_124[lVar38 + 1] = -(cVar4 * 4 + cVar3 * 4 + cVar2 * 4);
                *(short *)((long)&local_120 + lVar38 * 2 + 4) = cVar3 * 4 + cVar2 * -4 + cVar4 * -4;
                *(short *)((long)&local_118 + lVar38 * 2 + 2) = (short)cVar2 + cVar3 * 2 + cVar4 * 4
                ;
                *(short *)((long)&local_110 + lVar38 * 2) =
                     ((short)cVar2 - ((short)cVar3 + (short)cVar3)) + cVar4 * 4;
                (&sStack_10a)[lVar38] = cVar4 * 6;
                pcVar36 = pcVar36 + 3;
              }
              for (lVar38 = 0; lVar38 != 0x24; lVar38 = lVar38 + 6) {
                sVar5 = *(short *)((long)asStack_124 + lVar38 + -4);
                sVar6 = *(short *)((long)asStack_124 + lVar38 + -2);
                sVar7 = *(short *)((long)asStack_124 + lVar38);
                *psVar24 = sVar5 * 6;
                psVar24[1] = -(sVar7 * 4 + sVar6 * 4 + sVar5 * 4);
                psVar24[2] = sVar6 * 4 + sVar5 * -4 + sVar7 * -4;
                psVar24[3] = sVar5 + sVar6 * 2 + sVar7 * 4;
                psVar24[4] = sVar5 + sVar6 * -2 + sVar7 * 4;
                psVar24[5] = sVar7 * 6;
                psVar24 = psVar24 + 6;
              }
            }
          }
          local_fc = (this->weight_winograd43_data).w;
          local_f8 = (this->weight_winograd43_data).h;
          local_118 = (this->weight_winograd43_data).elemsize;
          local_110 = (this->weight_winograd43_data).elempack;
          local_108 = (this->weight_winograd43_data).allocator;
          local_e8 = (long)local_f8 * (long)local_fc;
          _TILE_M_2 = (void *)((long)(this->weight_winograd43_data).data +
                              local_118 * local_e8 *
                              (long)(int)((long)((ulong)(uint)((int)uVar44 >> 0x1f) << 0x20 |
                                                uVar44 & 0xffffffff) / (long)TILE_K) +
                              (this->weight_winograd43_data).cstep * uVar29 * local_118);
          local_120 = (int *)0x0;
          local_100 = 2;
          local_f4._0_4_ = 1;
          local_f4._4_4_ = 1;
          pack_A_tile_int8(&m,(Mat *)&TILE_M_2,0x24,local_78._0_4_,uVar14);
        }
      }
      piVar10 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar10 == (int *)0x0) goto LAB_00179064;
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 != 0) goto LAB_00179064;
      if (local_1a8.allocator != (Allocator *)0x0) {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
        goto LAB_00179064;
      }
    }
    else {
      get_optimal_tile_mnk_int8(uVar19,0,_h,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      local_78._4_4_ = 0;
      local_78._0_4_ = TILE_M;
      uVar47 = (long)(int)((uVar19 - 1) + TILE_M) / (long)TILE_M;
      local_1a8.cstep = 0;
      local_1a8.data = (void *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize = 0;
      local_1a8.elempack = 0;
      local_1a8.allocator = (Allocator *)0x0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
      Mat::create(&local_1a8,TILE_K * TILE_M * 0x10,1,opt->num_threads,2,(Allocator *)0x0);
      iVar13 = (int)uVar47;
      Mat::create(&this->weight_winograd23_data,TILE_K * TILE_M,0x10,
                  (int)(_h + TILE_K + -1) / TILE_K,iVar13,2,(Allocator *)0x0);
      uVar47 = uVar47 & 0xffffffff;
      if (iVar13 < 1) {
        uVar47 = 0;
      }
      for (uVar29 = 0; uVar29 != uVar47; uVar29 = uVar29 + 1) {
        iVar13 = get_omp_thread_num();
        psVar35 = (short *)((long)iVar13 * local_1a8.cstep * local_1a8.elemsize +
                           (long)local_1a8.data);
        m.refcount = (int *)0x0;
        m.elemsize = local_1a8.elemsize;
        m.elempack = local_1a8.elempack;
        m.allocator = local_1a8.allocator;
        m.w = local_1a8.w;
        m.d = 1;
        m.h = local_1a8.h;
        m.c = local_1a8.d;
        m.dims = local_1a8.dims + -1;
        m.cstep = (local_1a8.elemsize * (long)local_1a8.h * (long)local_1a8.w + 0xf &
                  0xfffffffffffffff0) / local_1a8.elemsize;
        if (local_1a8.dims == 4) {
          m.cstep = (long)local_1a8.h * (long)local_1a8.w;
        }
        uVar14 = local_78._0_4_;
        iVar13 = (int)uVar29 * uVar14;
        uVar15 = uVar19 - iVar13;
        if ((int)uVar14 < (int)uVar15) {
          uVar15 = uVar14;
        }
        uVar20 = 0;
        if (0 < (int)uVar15) {
          uVar20 = (ulong)uVar15;
        }
        m.data = psVar35;
        for (uVar44 = 0; (long)uVar44 < lVar21; uVar44 = uVar44 + (long)TILE_K) {
          uVar14 = _h - (int)uVar44;
          if (TILE_K < (int)uVar14) {
            uVar14 = TILE_K;
          }
          uVar17 = 0;
          if (0 < (int)uVar14) {
            uVar17 = (ulong)uVar14;
          }
          psVar24 = psVar35;
          for (uVar22 = 0; uVar22 != uVar20; uVar22 = uVar22 + 1) {
            pvVar25 = local_138->data;
            for (uVar32 = 0; uVar32 != uVar17; uVar32 = uVar32 + 1) {
              pcVar36 = (char *)((long)pvVar25 +
                                (uVar32 + uVar44) * 9 + (long)(int)((iVar13 + (int)uVar22) * _h * 9)
                                );
              for (lVar38 = 0; lVar18 = 4, lVar38 != 3; lVar38 = lVar38 + 1) {
                cVar2 = *pcVar36;
                cVar3 = pcVar36[1];
                cVar4 = pcVar36[2];
                asStack_124[lVar38 + -2] = cVar2 * 2;
                asStack_124[lVar38 + 1] = (short)cVar2 + (short)cVar3 + (short)cVar4;
                *(short *)((long)&local_120 + lVar38 * 2 + 4) =
                     ((short)cVar2 - (short)cVar3) + (short)cVar4;
                *(short *)((long)&local_118 + lVar38 * 2 + 2) = (short)cVar4 + (short)cVar4;
                pcVar36 = pcVar36 + 3;
              }
              for (; lVar18 != 0x1c; lVar18 = lVar18 + 6) {
                sVar5 = *(short *)((long)&TILE_M + lVar18);
                sVar6 = *(short *)((long)&TILE_M + lVar18 + 2);
                sVar7 = *(short *)((long)asStack_124 + lVar18 + -4);
                *psVar24 = sVar5 * 2;
                psVar24[1] = sVar6 + sVar5 + sVar7;
                psVar24[2] = (sVar5 - sVar6) + sVar7;
                psVar24[3] = sVar7 * 2;
                psVar24 = psVar24 + 4;
              }
            }
          }
          local_fc = (this->weight_winograd23_data).w;
          local_f8 = (this->weight_winograd23_data).h;
          local_118 = (this->weight_winograd23_data).elemsize;
          local_110 = (this->weight_winograd23_data).elempack;
          local_108 = (this->weight_winograd23_data).allocator;
          local_e8 = (long)local_f8 * (long)local_fc;
          _TILE_M_2 = (void *)((long)(this->weight_winograd23_data).data +
                              local_118 * local_e8 *
                              (long)(int)((long)((ulong)(uint)((int)uVar44 >> 0x1f) << 0x20 |
                                                uVar44 & 0xffffffff) / (long)TILE_K) +
                              (this->weight_winograd23_data).cstep * uVar29 * local_118);
          local_120 = (int *)0x0;
          local_100 = 2;
          local_f4._0_4_ = 1;
          local_f4._4_4_ = 1;
          pack_A_tile_int8(&m,(Mat *)&TILE_M_2,0x10,uVar15,uVar14);
        }
      }
      piVar10 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar10 == (int *)0x0) goto LAB_00179064;
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 != 0) goto LAB_00179064;
      if (local_1a8.allocator != (Allocator *)0x0) {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
        goto LAB_00179064;
      }
    }
  }
  else {
    if (opt->use_sgemm_convolution != true) {
      uVar15 = _h;
      if ((int)uVar19 < 0x10) {
        if ((int)uVar19 < 8) {
          if ((int)uVar19 < 4) {
            if ((int)uVar19 < 2) {
              if ((int)_h < 0x10) {
                if ((int)_h < 8) {
                  if ((int)_h < 2) {
                    sStackY_2e0 = 1;
                    iVar13 = 1;
                  }
                  else {
                    sStackY_2e0 = 2;
                    iVar13 = 2;
                    uVar15 = _h - (int)(uVar44 >> 1);
                  }
                }
                else {
                  sStackY_2e0 = 8;
                  iVar13 = 8;
                  uVar15 = (_h & 1) + ((uint)(uVar44 >> 1) & 3) + 1;
                }
              }
              else {
                sStackY_2e0 = 0x10;
                iVar13 = 0x10;
                uVar15 = (_h & 1) + (int)(uVar44 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                         ((uint)(uVar44 >> 1) & 3);
              }
            }
            else {
              if (0xf < (int)_h) {
                uVar15 = (_h & 1) + ((uint)(uVar29 >> 4) & 0xfffffff) + (uint)((_h >> 3 & 1) != 0) +
                         ((uint)(uVar44 >> 1) & 3);
                uVar19 = (uVar19 & 1) + 1;
                goto LAB_00178c77;
              }
              if (7 < (int)_h) {
                uVar15 = (_h & 1) + ((uint)(uVar44 >> 1) & 3) + 1;
                uVar19 = (uVar19 & 1) + 1;
                goto LAB_0017918c;
              }
              if ((int)_h < 2) {
                uVar19 = (uVar19 & 1) + 1;
                sStackY_2e0 = 2;
                iVar13 = 2;
              }
              else {
                uVar19 = (uVar19 & 1) + 1;
                sStackY_2e0 = 4;
                iVar13 = 4;
                uVar15 = _h - (int)(uVar44 >> 1);
              }
            }
          }
          else {
            if (0xf < (int)_h) {
              uVar15 = (_h & 1) + (int)(uVar44 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                       ((uint)(uVar44 >> 1) & 3);
              uVar19 = (uVar19 & 1) + 1 + (uint)((uVar19 >> 1 & 1) != 0);
              goto LAB_00178bbd;
            }
            if ((int)_h < 8) {
              if ((int)_h < 2) {
                uVar19 = (uVar19 & 1) + 1 + (uint)((uVar19 >> 1 & 1) != 0);
                sStackY_2e0 = 4;
                iVar13 = 4;
              }
              else {
                uVar19 = (uVar19 & 1) + 1 + (uint)((uVar19 >> 1 & 1) != 0);
                sStackY_2e0 = 8;
                iVar13 = 8;
                uVar15 = _h - (int)(uVar44 >> 1);
              }
            }
            else {
              uVar15 = (_h & 1) + ((uint)(uVar44 >> 1) & 3) + 1;
              uVar19 = (uVar19 & 1) + 1 + (uint)((uVar19 >> 1 & 1) != 0);
LAB_00178c77:
              sStackY_2e0 = 0x20;
              iVar13 = 0x20;
            }
          }
        }
        else {
          if (0xf < (int)_h) {
            uVar15 = (_h & 1) + (int)(uVar44 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                     ((uint)(uVar29 >> 1) & 3);
            uVar19 = (uVar19 & 1) + 1 + ((uint)(uVar20 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0);
            goto LAB_00178b26;
          }
          if ((int)_h < 8) {
            if ((int)_h < 2) {
              uVar19 = (uVar19 & 1) + 1 + ((uint)(uVar20 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0)
              ;
              sStackY_2e0 = 8;
              iVar13 = 8;
            }
            else {
              uVar15 = _h - (int)(uVar44 >> 1);
              uVar19 = (uVar19 & 1) + 1 + ((uint)(uVar20 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0)
              ;
LAB_0017918c:
              sStackY_2e0 = 0x10;
              iVar13 = 0x10;
            }
          }
          else {
            uVar15 = (_h & 1) + ((uint)(uVar29 >> 1) & 3) + 1;
            uVar19 = (uVar19 & 1) + 1 + ((uint)(uVar20 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0);
LAB_00178bbd:
            sStackY_2e0 = 0x40;
            iVar13 = 0x40;
          }
        }
      }
      else if ((int)_h < 0x10) {
        if ((int)_h < 8) {
          if (1 < (int)_h) {
            uVar15 = _h - ((uint)(uVar29 >> 1) & 0x7fffffff);
            uVar19 = (uVar19 & 1) + ((uint)(uVar20 >> 4) & 0xfffffff) +
                     (uint)((uVar19 >> 3 & 1) != 0) + ((uint)(uVar20 >> 2) & 1) +
                     (uint)((uVar19 >> 1 & 1) != 0);
            goto LAB_00178c77;
          }
          uVar19 = (uVar19 & 1) + ((uint)(uVar20 >> 4) & 0xfffffff) + (uint)((uVar19 >> 3 & 1) != 0)
                   + ((uint)(uVar20 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0);
          sStackY_2e0 = 0x10;
          iVar13 = 0x10;
        }
        else {
          uVar15 = (_h & 1) + ((uint)(uVar29 >> 1) & 3) + 1;
          uVar19 = (uVar19 & 1) + ((uint)(uVar20 >> 4) & 0xfffffff) + (uint)((uVar19 >> 3 & 1) != 0)
                   + ((uint)(uVar20 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0);
LAB_00178b26:
          sStackY_2e0 = 0x80;
          iVar13 = 0x80;
        }
      }
      else {
        uVar19 = (uVar19 & 1) + ((uint)(uVar20 >> 4) & 0xfffffff) + (uint)((uVar19 >> 3 & 1) != 0) +
                 ((uint)(uVar20 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0);
        sStackY_2e0 = 0x100;
        iVar13 = 0x100;
        uVar15 = (_h & 1) + (int)(uVar44 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                 ((uint)(uVar44 >> 1) & 3);
      }
      Mat::create(&this->weight_data_tm,uVar14,uVar15,uVar19,sStackY_2e0,iVar13,(Allocator *)0x0);
      uVar19 = _h * uVar14;
      local_230 = (ulong)uVar19;
      auVar77 = vpbroadcastd_avx512f(ZEXT416(uVar14));
      auVar78 = vpmovsxbd_avx512f(_DAT_005386d0);
      vpmulld_avx512f(auVar77,auVar78);
      local_140 = (long)(int)(uVar14 << 4);
      auVar95 = vpmulld_avx2(auVar77._0_32_,auVar78._0_32_);
      local_78 = vmovdqu64_avx512f(ZEXT3264(auVar95));
      local_148 = (long)(int)(uVar14 * 8);
      auVar77 = vpbroadcastd_avx512f();
      auVar57 = auVar77._0_16_;
      auVar55 = vpunpckldq_avx512vl(auVar57,ZEXT416(uVar19 + uVar14));
      auVar56 = vshufps_avx512vl(ZEXT416(uVar14),auVar55,0x41);
      local_260 = uVar19 * 2;
      auVar55 = vpaddd_avx(auVar57,auVar57);
      auVar55 = vpaddd_avx(auVar55,auVar56);
      auVar95._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar56;
      auVar95._16_16_ = ZEXT116(1) * auVar55;
      auVar93 = ZEXT3264(auVar95);
      local_20c = uVar19 * 4;
      auVar100 = vpslld_avx2(auVar77._0_32_,2);
      auVar75 = vmovdqa64_avx512vl(auVar95);
      auVar95 = vpaddd_avx2(auVar100,auVar95);
      auVar101 = ZEXT3264(auVar95);
      auVar79 = vinserti32x4_avx512f(ZEXT1664(auVar56),auVar55,1);
      vinserti64x4_avx512f(auVar79,auVar95,1);
      lVar21 = (long)(int)(uVar14 * 2);
      vpmulld_avx512f(auVar77,auVar78);
      uVar47 = 0;
      if (0 < (int)uVar14) {
        uVar47 = (ulong)uVar14;
      }
      iVar13 = uVar19 * 0x10;
      local_25c = uVar19 * 3;
      local_210 = uVar19 * 5;
      local_214 = uVar19 * 6;
      local_218 = uVar19 * 7;
      uVar29 = 0;
      uVar44 = 0;
      local_264 = uVar19;
      while (uVar22 = uVar44, uVar17 = uVar29, (long)(uVar17 | 0xf) < (long)uVar20) {
        pvVar25 = (this->super_Convolution).weight_data.data;
        uVar15 = (uint)uVar17;
        lVar42 = (long)(int)(uVar19 * uVar15) + (long)pvVar25;
        lVar38 = (long)(int)((uVar15 | 1) * uVar19) + (long)pvVar25;
        local_2a0 = (long)(int)((uVar15 | 2) * uVar19) + (long)pvVar25;
        local_290 = (long)(int)((uVar15 | 3) * uVar19) + (long)pvVar25;
        local_298 = (long)(int)((uVar15 | 4) * uVar19) + (long)pvVar25;
        local_2a8 = (long)(int)((uVar15 | 5) * uVar19) + (long)pvVar25;
        lVar52 = (long)(int)((uVar15 | 6) * uVar19) + (long)pvVar25;
        lVar48 = (long)(int)((uVar15 | 7) * uVar19) + (long)pvVar25;
        lVar49 = (long)(int)((uVar15 | 8) * uVar19) + (long)pvVar25;
        lVar26 = (long)(int)((uVar15 | 9) * uVar19) + (long)pvVar25;
        lVar23 = (long)(int)((uVar15 | 10) * uVar19) + (long)pvVar25;
        lVar33 = (long)(int)((uVar15 | 0xb) * uVar19) + (long)pvVar25;
        lVar45 = (long)(int)((uVar15 | 0xc) * uVar19) + (long)pvVar25;
        lVar39 = (long)(int)((uVar15 | 0xd) * uVar19) + (long)pvVar25;
        lVar18 = (long)(int)((uVar15 | 0xe) * uVar19) + (long)pvVar25;
        lVar30 = (long)(int)((int)(uVar17 | 0xf) * uVar19) + (long)pvVar25;
        pauVar37 = (undefined1 (*) [16])
                   ((uVar17 >> 4) * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        for (uVar15 = 0; (int)(uVar15 | 0xf) < (int)_h; uVar15 = uVar15 + 0x10) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(lVar42 + uVar29 + lVar39));
            auVar78 = vpgatherdd_avx512f(*(undefined4 *)(lVar38 + uVar29 + lVar39));
            auVar79 = vpgatherdd_avx512f(*(undefined4 *)(local_2a0 + uVar29 + lVar39));
            auVar80 = vpgatherdd_avx512f(*(undefined4 *)(local_290 + uVar29 + lVar39));
            auVar81 = vpgatherdd_avx512f(*(undefined4 *)(local_298 + uVar29 + lVar39));
            auVar82 = vpgatherdd_avx512f(*(undefined4 *)(local_2a8 + uVar29 + lVar39));
            auVar83 = vpgatherdd_avx512f(*(undefined4 *)(lVar52 + uVar29 + lVar39));
            auVar84 = vpgatherdd_avx512f(*(undefined4 *)(lVar48 + uVar29 + lVar39));
            auVar85 = vpgatherdd_avx512f(*(undefined4 *)(lVar49 + uVar29 + lVar39));
            auVar86 = vpgatherdd_avx512f(*(undefined4 *)(lVar26 + uVar29 + lVar39));
            auVar87 = vpgatherdd_avx512f(*(undefined4 *)(lVar23 + uVar29 + lVar39));
            auVar88 = vpgatherdd_avx512f(*(undefined4 *)(lVar33 + uVar29 + lVar39));
            vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
            auVar89 = vpgatherdd_avx512f(*(undefined4 *)(lVar45 + uVar29 + lVar39));
            vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
            auVar90 = vpgatherdd_avx512f(*(undefined4 *)(lVar39 * 2 + uVar29));
            vpxord_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
            auVar91 = vpgatherdd_avx512f(*(undefined4 *)(lVar18 + uVar29 + lVar39));
            vpxord_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
            auVar92 = vpgatherdd_avx512f(*(undefined4 *)(lVar30 + uVar29 + lVar39));
            auVar55 = vpmovdb_avx512f(auVar77);
            auVar56 = vpmovdb_avx512f(auVar78);
            auVar57 = vpmovdb_avx512f(auVar79);
            auVar58 = vpmovdb_avx512f(auVar80);
            auVar59 = vpmovdb_avx512f(auVar81);
            auVar60 = vpmovdb_avx512f(auVar82);
            auVar61 = vpmovdb_avx512f(auVar83);
            auVar62 = vpmovdb_avx512f(auVar84);
            auVar63 = vpmovdb_avx512f(auVar85);
            auVar64 = vpmovdb_avx512f(auVar86);
            auVar65 = vpmovdb_avx512f(auVar87);
            auVar66 = vpmovdb_avx512f(auVar88);
            auVar67 = vpmovdb_avx512f(auVar89);
            auVar68 = vpmovdb_avx512f(auVar90);
            auVar69 = vpmovdb_avx512f(auVar91);
            auVar70 = vpmovdb_avx512f(auVar92);
            auVar71 = vpunpcklwd_avx512vl(auVar55,auVar56);
            auVar55 = vpunpckhwd_avx(auVar55,auVar56);
            auVar74 = vpunpcklwd_avx(auVar57,auVar58);
            auVar56 = vpunpckhwd_avx(auVar57,auVar58);
            auVar73 = vpunpcklwd_avx(auVar59,auVar60);
            auVar57 = vpunpckhwd_avx(auVar59,auVar60);
            auVar72 = vpunpcklwd_avx(auVar61,auVar62);
            auVar58 = vpunpckhwd_avx(auVar61,auVar62);
            auVar61 = vpunpcklwd_avx(auVar63,auVar64);
            auVar59 = vpunpckhwd_avx(auVar63,auVar64);
            auVar62 = vpunpcklwd_avx(auVar65,auVar66);
            auVar60 = vpunpckhwd_avx(auVar65,auVar66);
            auVar63 = vpunpcklwd_avx512vl(auVar67,auVar68);
            auVar64 = vpunpckhwd_avx512vl(auVar67,auVar68);
            auVar65 = vpunpcklwd_avx512vl(auVar69,auVar70);
            auVar66 = vpunpckhwd_avx512vl(auVar69,auVar70);
            auVar67 = vpunpckldq_avx512vl(auVar71,auVar74);
            auVar68 = vpunpckhdq_avx512vl(auVar71,auVar74);
            auVar69 = vpunpckldq_avx512vl(auVar55,auVar56);
            auVar55 = vpunpckhdq_avx(auVar55,auVar56);
            auVar74 = vpunpckldq_avx(auVar73,auVar72);
            auVar56 = vpunpckhdq_avx(auVar73,auVar72);
            auVar73 = vpunpckldq_avx(auVar57,auVar58);
            auVar57 = vpunpckhdq_avx(auVar57,auVar58);
            auVar72 = vpunpckldq_avx(auVar61,auVar62);
            auVar58 = vpunpckhdq_avx(auVar61,auVar62);
            auVar61 = vpunpckldq_avx(auVar59,auVar60);
            auVar59 = vpunpckhdq_avx(auVar59,auVar60);
            auVar60 = vpunpckldq_avx512vl(auVar63,auVar65);
            auVar62 = vpunpckhdq_avx512vl(auVar63,auVar65);
            auVar63 = vpunpckldq_avx512vl(auVar64,auVar66);
            auVar64 = vpunpckhdq_avx512vl(auVar64,auVar66);
            in_ZMM18 = ZEXT1664(auVar64);
            auVar65 = vpunpcklqdq_avx512vl(auVar67,auVar74);
            in_ZMM20 = ZEXT1664(auVar65);
            auVar66 = vpunpcklqdq_avx512vl(auVar72,auVar60);
            auVar67 = vpunpckhqdq_avx512vl(auVar67,auVar74);
            auVar60 = vpunpckhqdq_avx(auVar72,auVar60);
            auVar79 = ZEXT1664(auVar60);
            auVar74 = vpunpcklqdq_avx(auVar68,auVar56);
            auVar72 = vpunpcklqdq_avx512vl(auVar58,auVar62);
            in_ZMM21 = ZEXT1664(auVar72);
            auVar56 = vpunpckhqdq_avx(auVar68,auVar56);
            auVar77 = ZEXT1664(auVar56);
            auVar58 = vpunpckhqdq_avx(auVar58,auVar62);
            auVar62 = vpunpcklqdq_avx512vl(auVar69,auVar73);
            auVar68 = vpunpcklqdq_avx512vl(auVar61,auVar63);
            auVar73 = vpunpckhqdq_avx512vl(auVar69,auVar73);
            auVar61 = vpunpckhqdq_avx512vl(auVar61,auVar63);
            auVar63 = vpunpcklqdq_avx512vl(auVar55,auVar57);
            in_ZMM19 = ZEXT1664(auVar63);
            auVar69 = vpunpcklqdq_avx512vl(auVar59,auVar64);
            auVar57 = vpunpckhqdq_avx(auVar55,auVar57);
            auVar78 = ZEXT1664(auVar57);
            auVar59 = vpunpckhqdq_avx512vl(auVar59,auVar64);
            auVar55 = vmovdqu64_avx512vl(auVar65);
            *pauVar37 = auVar55;
            auVar55 = vmovdqu64_avx512vl(auVar66);
            pauVar37[1] = auVar55;
            pauVar37[2] = auVar67;
            pauVar37[3] = auVar60;
            pauVar37[4] = auVar74;
            auVar55 = vmovdqu64_avx512vl(auVar72);
            pauVar37[5] = auVar55;
            pauVar37[6] = auVar56;
            pauVar37[7] = auVar58;
            pauVar37[8] = auVar62;
            pauVar37[9] = auVar68;
            pauVar37[10] = auVar73;
            pauVar37[0xb] = auVar61;
            auVar55 = vmovdqu64_avx512vl(auVar63);
            pauVar37[0xc] = auVar55;
            auVar55 = vmovdqu64_avx512vl(auVar69);
            pauVar37[0xd] = auVar55;
            pauVar37[0xe] = auVar57;
            pauVar37[0xf] = auVar59;
            pauVar37 = pauVar37 + 0x10;
          }
          lVar42 = lVar42 + local_140;
          lVar38 = lVar38 + local_140;
          local_2a0 = local_2a0 + local_140;
          local_290 = local_290 + local_140;
          local_298 = local_298 + local_140;
          local_2a8 = local_2a8 + local_140;
          lVar52 = lVar52 + local_140;
          lVar48 = lVar48 + local_140;
          lVar49 = lVar49 + local_140;
          lVar26 = lVar26 + local_140;
          lVar23 = lVar23 + local_140;
          lVar33 = lVar33 + local_140;
          lVar45 = lVar45 + local_140;
          lVar39 = lVar39 + local_140;
          lVar18 = lVar18 + local_140;
          lVar30 = lVar30 + local_140;
        }
        for (; (int)(uVar15 | 7) < (int)_h; uVar15 = uVar15 + 8) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar95 = vpcmpeqd_avx2(auVar78._0_32_,auVar78._0_32_);
            vmovdqu64_avx512f(local_78);
            auVar95 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar100 = vmovdqa64_avx512vl(auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar95 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar76 = vmovdqa64_avx512vl(auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar104 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar105 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar106 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar107 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar108 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar110 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar112 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2(auVar77._0_32_,auVar77._0_32_);
            auVar103 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2(auVar79._0_32_,auVar79._0_32_);
            auVar102 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2(auVar101._0_32_,auVar101._0_32_);
            auVar97 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar99 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar96 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar98 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar95 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar95 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar55 = vpmovdb_avx512vl(auVar100);
            auVar56 = vpmovdb_avx512vl(auVar76);
            auVar57 = vpmovdb_avx512vl(auVar104);
            auVar58 = vpmovdb_avx512vl(auVar105);
            auVar59 = vpmovdb_avx512vl(auVar106);
            auVar60 = vpmovdb_avx512vl(auVar107);
            auVar74 = vpmovdb_avx512vl(auVar108);
            auVar73 = vpmovdb_avx512vl(auVar110);
            auVar72 = vpmovdb_avx512vl(auVar112);
            auVar61 = vpmovdb_avx512vl(auVar103);
            in_ZMM18 = ZEXT864(auVar61._0_8_);
            auVar62 = vpmovdb_avx512vl(auVar102);
            in_ZMM19 = ZEXT864(auVar62._0_8_);
            auVar63 = vpmovdb_avx512vl(auVar97);
            auVar64 = vpmovdb_avx512vl(auVar99);
            auVar65 = vpmovdb_avx512vl(auVar96);
            auVar66._8_8_ = 0;
            auVar66._0_8_ = auVar56._0_8_;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = auVar55._0_8_;
            auVar55 = vpunpcklwd_avx(auVar67,auVar66);
            auVar68._8_8_ = 0;
            auVar68._0_8_ = auVar57._0_8_;
            auVar69._8_8_ = 0;
            auVar69._0_8_ = auVar58._0_8_;
            auVar56 = vpunpcklwd_avx(auVar68,auVar69);
            auVar58._8_8_ = 0;
            auVar58._0_8_ = auVar59._0_8_;
            auVar70._8_8_ = 0;
            auVar70._0_8_ = auVar60._0_8_;
            auVar57 = vpunpcklwd_avx(auVar58,auVar70);
            auVar71._8_8_ = 0;
            auVar71._0_8_ = auVar74._0_8_;
            auVar109._8_8_ = 0;
            auVar109._0_8_ = auVar73._0_8_;
            auVar58 = vpunpcklwd_avx(auVar71,auVar109);
            auVar111._8_8_ = 0;
            auVar111._0_8_ = auVar72._0_8_;
            auVar72._8_8_ = 0;
            auVar72._0_8_ = auVar61._0_8_;
            auVar72 = vpunpcklwd_avx512vl(auVar111,auVar72);
            auVar60._8_8_ = 0;
            auVar60._0_8_ = auVar63._0_8_;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = auVar62._0_8_;
            auVar61 = vpunpcklwd_avx512vl(auVar61,auVar60);
            auVar59._8_8_ = 0;
            auVar59._0_8_ = auVar65._0_8_;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = auVar64._0_8_;
            auVar59 = vpunpcklwd_avx(auVar62,auVar59);
            auVar60 = vpmovdb_avx512vl(auVar98);
            auVar74 = vpmovdb_avx512vl(auVar95);
            auVar73._8_8_ = 0;
            auVar73._0_8_ = auVar74._0_8_;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = auVar60._0_8_;
            auVar60 = vpunpcklwd_avx(auVar74,auVar73);
            auVar74 = vpunpckldq_avx(auVar55,auVar56);
            auVar55 = vpunpckhdq_avx(auVar55,auVar56);
            auVar73 = vpunpckldq_avx(auVar72,auVar61);
            auVar56 = vpunpckhdq_avx(auVar72,auVar61);
            auVar77 = ZEXT1664(auVar56);
            auVar72 = vpunpckldq_avx(auVar57,auVar58);
            auVar57 = vpunpckhdq_avx(auVar57,auVar58);
            auVar61 = vpunpckldq_avx(auVar59,auVar60);
            auVar58 = vpunpckhdq_avx(auVar59,auVar60);
            auVar60 = vpunpcklqdq_avx(auVar74,auVar72);
            auVar59 = vpunpckhqdq_avx(auVar74,auVar72);
            auVar78 = ZEXT1664(auVar59);
            auVar74 = vpunpcklqdq_avx(auVar55,auVar57);
            auVar101 = ZEXT1664(auVar74);
            auVar55 = vpunpckhqdq_avx(auVar55,auVar57);
            auVar79 = ZEXT1664(auVar55);
            auVar72 = vpunpcklqdq_avx(auVar73,auVar61);
            auVar57 = vpunpckhqdq_avx(auVar73,auVar61);
            auVar73 = vpunpcklqdq_avx(auVar56,auVar58);
            auVar56 = vpunpckhqdq_avx(auVar56,auVar58);
            auVar93 = ZEXT1664(auVar56);
            *pauVar37 = auVar60;
            pauVar37[1] = auVar72;
            pauVar37[2] = auVar59;
            pauVar37[3] = auVar57;
            pauVar37[4] = auVar74;
            pauVar37[5] = auVar73;
            pauVar37[6] = auVar55;
            pauVar37[7] = auVar56;
            pauVar37 = pauVar37 + 8;
          }
          lVar42 = lVar42 + local_148;
          lVar38 = lVar38 + local_148;
          lVar49 = lVar49 + local_148;
        }
        for (; (int)(uVar15 | 1) < (int)_h; uVar15 = uVar15 + 2) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar93 = vpgatherdd_avx512f(*(undefined4 *)(*pauVar37 + lVar42 + uVar29));
            auVar80 = vpgatherdd_avx512f(*(undefined4 *)(*pauVar37 + lVar49 + uVar29));
            auVar55 = vpmovdb_avx512f(auVar93);
            *pauVar37 = auVar55;
            auVar55 = vpmovdb_avx512f(auVar80);
            pauVar37[1] = auVar55;
            pauVar37 = pauVar37 + 2;
          }
          lVar42 = lVar42 + lVar21;
          lVar49 = lVar49 + lVar21;
        }
        for (; (int)uVar15 < (int)_h; uVar15 = uVar15 + 1) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar93 = vpgatherdd_avx512f(*(undefined4 *)(lVar42 + uVar29 + lVar38));
            auVar55 = vpmovdb_avx512f(auVar93);
            *pauVar37 = auVar55;
            pauVar37 = pauVar37 + 1;
          }
        }
        local_264 = local_264 + iVar13;
        local_260 = local_260 + iVar13;
        local_25c = local_25c + iVar13;
        local_20c = local_20c + iVar13;
        local_210 = local_210 + iVar13;
        local_214 = local_214 + iVar13;
        local_218 = local_218 + iVar13;
        uVar44 = (ulong)(uint)((int)uVar22 + iVar13);
        local_160 = uVar17;
        local_158 = uVar22;
        uVar29 = uVar17 + 0x10;
      }
      local_d8 = (long)(int)uVar14;
      auVar95 = vpbroadcastd_avx512vl();
      vpmulld_avx2(auVar95,_DAT_00539700);
      local_cc = uVar19 * 8;
      while (uVar44 = uVar22, uVar29 = uVar17, (long)(uVar29 | 7) < (long)uVar20) {
        pvVar25 = (this->super_Convolution).weight_data.data;
        uVar15 = (uint)uVar29;
        lVar30 = (long)(int)(uVar19 * uVar15) + (long)pvVar25;
        local_c0 = (long)(int)((uVar15 | 1) * uVar19) + (long)pvVar25;
        lVar26 = (long)(int)((uVar15 | 2) * uVar19) + (long)pvVar25;
        local_280 = (long)(int)((uVar15 | 3) * uVar19) + (long)pvVar25;
        local_220 = (long)(int)((uVar15 | 4) * uVar19) + (long)pvVar25;
        local_228 = (long)(int)((uVar15 | 5) * uVar19) + (long)pvVar25;
        local_1b0 = (long)(int)((uVar15 | 6) * uVar19) + (long)pvVar25;
        local_1b8 = (long)(int)((int)(uVar29 | 7) * uVar19) + (long)pvVar25;
        lVar33 = (long)pvVar25 + (int)uVar44 + local_d8;
        lVar18 = (long)pvVar25 + (int)local_264 + local_d8;
        lVar23 = (long)pvVar25 + local_260 + local_d8;
        lVar38 = (long)pvVar25 + local_25c + local_d8;
        local_150 = (long)pvVar25 + local_20c + local_d8;
        lVar42 = (long)pvVar25 + local_210 + local_d8;
        local_1c0 = (long)pvVar25 + local_214 + local_d8;
        lVar39 = (long)pvVar25 + local_218 + local_d8;
        pauVar37 = (undefined1 (*) [16])
                   ((ulong)(((uint)(uVar29 >> 4) & 0xfffffff) + (uint)((uVar15 >> 3 & 1) != 0)) *
                    (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        for (uVar15 = 0; (int)(uVar15 | 0xf) < (int)_h; uVar15 = uVar15 + 0x10) {
          for (uVar17 = 0; uVar47 != uVar17; uVar17 = uVar17 + 1) {
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(lVar30 * 2 + uVar17));
            auVar55 = vpmovdb_avx512f(auVar77);
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(local_c0 + uVar17 + lVar30));
            auVar56 = vpmovdb_avx512f(auVar77);
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(lVar26 + uVar17 + lVar30));
            auVar57 = vpmovdb_avx512f(auVar77);
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(local_280 + uVar17 + lVar30));
            auVar58 = vpmovdb_avx512f(auVar77);
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(local_220 + uVar17 + lVar30));
            auVar73 = vpmovdb_avx512f(auVar77);
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(local_228 + uVar17 + lVar30));
            auVar72 = vpmovdb_avx512f(auVar77);
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(local_1b0 + uVar17 + lVar30));
            auVar61 = vpmovdb_avx512f(auVar77);
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(local_1b8 + uVar17 + lVar30));
            auVar62 = vpmovdb_avx512f(auVar77);
            auVar59 = vpunpcklwd_avx(auVar55,auVar56);
            auVar55 = vpunpckhwd_avx(auVar55,auVar56);
            auVar60 = vpunpcklwd_avx(auVar57,auVar58);
            auVar56 = vpunpckhwd_avx(auVar57,auVar58);
            auVar74 = vpunpcklwd_avx(auVar73,auVar72);
            auVar57 = vpunpckhwd_avx(auVar73,auVar72);
            auVar73 = vpunpcklwd_avx(auVar61,auVar62);
            auVar58 = vpunpckhwd_avx(auVar61,auVar62);
            auVar72 = vpunpckldq_avx(auVar59,auVar60);
            auVar59 = vpunpckhdq_avx(auVar59,auVar60);
            auVar60 = vpunpckldq_avx(auVar55,auVar56);
            auVar55 = vpunpckhdq_avx(auVar55,auVar56);
            auVar61 = vpunpckldq_avx(auVar74,auVar73);
            auVar56 = vpunpckhdq_avx(auVar74,auVar73);
            auVar74 = vpunpckldq_avx(auVar57,auVar58);
            auVar57 = vpunpckhdq_avx(auVar57,auVar58);
            auVar73 = vpunpcklqdq_avx(auVar72,auVar61);
            auVar58 = vpunpckhqdq_avx(auVar72,auVar61);
            auVar72 = vpunpcklqdq_avx(auVar59,auVar56);
            auVar56 = vpunpckhqdq_avx(auVar59,auVar56);
            auVar61 = vpunpcklqdq_avx(auVar60,auVar74);
            auVar59 = vpunpckhqdq_avx(auVar60,auVar74);
            auVar60 = vpunpcklqdq_avx(auVar55,auVar57);
            auVar55 = vpunpckhqdq_avx(auVar55,auVar57);
            auVar93 = ZEXT1664(auVar55);
            *pauVar37 = auVar73;
            pauVar37[1] = auVar58;
            pauVar37[2] = auVar72;
            pauVar37[3] = auVar56;
            pauVar37[4] = auVar61;
            pauVar37[5] = auVar59;
            pauVar37[6] = auVar60;
            pauVar37[7] = auVar55;
            pauVar37 = pauVar37 + 8;
          }
          lVar30 = lVar30 + local_140;
          local_c0 = local_c0 + local_140;
          lVar26 = lVar26 + local_140;
          local_280 = local_280 + local_140;
          local_220 = local_220 + local_140;
          local_228 = local_228 + local_140;
          local_1b0 = local_1b0 + local_140;
          local_1b8 = local_1b8 + local_140;
          lVar33 = lVar33 + local_140;
          lVar18 = lVar18 + local_140;
          lVar23 = lVar23 + local_140;
          lVar38 = lVar38 + local_140;
          local_150 = local_150 + local_140;
          lVar42 = lVar42 + local_140;
          local_1c0 = local_1c0 + local_140;
          lVar39 = lVar39 + local_140;
        }
        while (uVar34 = uVar15, lVar53 = lVar42, lVar50 = lVar39, lVar43 = lVar33, lVar40 = lVar30,
              lVar52 = lVar26, lVar49 = lVar23, lVar48 = lVar18, lVar45 = lVar38,
              (int)(uVar34 | 7) < (int)_h) {
          local_2a0 = local_1b8;
          local_298 = local_1b0;
          local_2b8 = local_228;
          lVar38 = lVar49;
          lVar18 = lVar45;
          lVar23 = lVar48;
          lVar26 = lVar40;
          lVar30 = local_c0;
          lVar33 = lVar52;
          lVar39 = lVar43;
          uVar17 = local_150;
          lVar42 = local_220;
          lVar51 = local_280;
          lVar54 = lVar53;
          local_2a8 = local_1c0;
          local_290 = lVar50;
          for (uVar22 = 0; uVar22 != uVar47; uVar22 = uVar22 + 1) {
            lVar31 = 0;
            for (lVar27 = 0; (int)lVar27 != 0x40; lVar27 = lVar27 + 0x10) {
              (*pauVar37)[lVar27] = *(undefined1 *)(lVar26 + lVar31);
              (*pauVar37)[lVar27 + 1] = *(undefined1 *)(lVar39 + lVar31);
              (*pauVar37)[lVar27 + 2] = *(undefined1 *)(lVar30 + lVar31);
              (*pauVar37)[lVar27 + 3] = *(undefined1 *)(lVar23 + lVar31);
              (*pauVar37)[lVar27 + 4] = *(undefined1 *)(lVar33 + lVar31);
              (*pauVar37)[lVar27 + 5] = *(undefined1 *)(lVar38 + lVar31);
              (*pauVar37)[lVar27 + 6] = *(undefined1 *)(lVar51 + lVar31);
              (*pauVar37)[lVar27 + 7] = *(undefined1 *)(lVar18 + lVar31);
              (*pauVar37)[lVar27 + 8] = *(undefined1 *)(lVar42 + lVar31);
              (*pauVar37)[lVar27 + 9] = *(undefined1 *)(uVar17 + lVar31);
              (*pauVar37)[lVar27 + 10] = *(undefined1 *)(local_2b8 + lVar31);
              (*pauVar37)[lVar27 + 0xb] = *(undefined1 *)(lVar54 + lVar31);
              (*pauVar37)[lVar27 + 0xc] = *(undefined1 *)(local_298 + lVar31);
              (*pauVar37)[lVar27 + 0xd] = *(undefined1 *)(local_2a8 + lVar31);
              (*pauVar37)[lVar27 + 0xe] = *(undefined1 *)(local_2a0 + lVar31);
              (*pauVar37)[lVar27 + 0xf] = *(undefined1 *)(local_290 + lVar31);
              lVar31 = lVar31 + lVar21;
            }
            pauVar37 = (undefined1 (*) [16])(*pauVar37 + lVar27);
            lVar39 = lVar39 + 1;
            lVar26 = lVar26 + 1;
            lVar23 = lVar23 + 1;
            lVar30 = lVar30 + 1;
            lVar38 = lVar38 + 1;
            lVar33 = lVar33 + 1;
            lVar18 = lVar18 + 1;
            lVar51 = lVar51 + 1;
            uVar17 = uVar17 + 1;
            lVar42 = lVar42 + 1;
            lVar54 = lVar54 + 1;
            local_2b8 = local_2b8 + 1;
            local_2a8 = local_2a8 + 1;
            local_298 = local_298 + 1;
            local_290 = local_290 + 1;
            local_2a0 = local_2a0 + 1;
          }
          local_c0 = local_c0 + local_148;
          local_280 = local_280 + local_148;
          local_220 = local_220 + local_148;
          local_228 = local_228 + local_148;
          local_1b0 = local_1b0 + local_148;
          local_1b8 = local_1b8 + local_148;
          local_150 = local_150 + local_148;
          local_1c0 = local_1c0 + local_148;
          lVar38 = lVar45 + local_148;
          lVar18 = lVar48 + local_148;
          lVar23 = lVar49 + local_148;
          lVar26 = lVar52 + local_148;
          lVar30 = lVar40 + local_148;
          lVar33 = lVar43 + local_148;
          lVar39 = lVar50 + local_148;
          lVar42 = lVar53 + local_148;
          local_c8 = uVar34;
          local_b8 = lVar53;
          local_b0 = lVar52;
          local_a8 = lVar50;
          local_a0 = lVar45;
          local_98 = lVar49;
          local_90 = lVar48;
          local_88 = lVar43;
          local_80 = lVar40;
          uVar15 = uVar34 + 8;
        }
        for (; (int)(uVar34 | 1) < (int)_h; uVar34 = uVar34 + 2) {
          for (uVar17 = 0; uVar47 != uVar17; uVar17 = uVar17 + 1) {
            auVar93 = vpgatherdd_avx512f(*(undefined4 *)(lVar40 + uVar17 + lVar52));
            auVar55 = vpmovdb_avx512f(auVar93);
            *pauVar37 = auVar55;
            pauVar37 = pauVar37 + 1;
          }
          lVar40 = lVar40 + lVar21;
        }
        for (; (int)uVar34 < (int)_h; uVar34 = uVar34 + 1) {
          for (uVar17 = 0; uVar47 != uVar17; uVar17 = uVar17 + 1) {
            auVar100 = vpcmpeqd_avx2(auVar93._0_32_,auVar93._0_32_);
            auVar100 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar100);
            auVar93 = ZEXT3264((undefined1  [32])0x0);
            auVar55 = vpmovdb_avx512vl(auVar100);
            *(long *)*pauVar37 = auVar55._0_8_;
            pauVar37 = (undefined1 (*) [16])(*pauVar37 + 8);
          }
        }
        local_264 = local_264 + local_cc;
        local_260 = local_260 + local_cc;
        local_25c = local_25c + local_cc;
        local_20c = local_20c + local_cc;
        local_210 = local_210 + local_cc;
        local_214 = local_214 + local_cc;
        local_218 = local_218 + local_cc;
        uVar22 = (ulong)(uint)((int)uVar44 + local_cc);
        local_160 = uVar29;
        local_158 = uVar44;
        uVar17 = uVar29 + 8;
      }
      auVar55 = vpbroadcastd_avx512vl();
      auVar77 = ZEXT1664(auVar55);
      vpmulld_avx(auVar55,_DAT_00538390);
      uVar15 = uVar19 * 4;
      local_150 = (ulong)uVar15;
      while (uVar22 = uVar44, uVar17 = uVar29, (long)(uVar17 | 3) < (long)uVar20) {
        iVar13 = (int)uVar22;
        pvVar25 = (this->super_Convolution).weight_data.data;
        uVar34 = (uint)uVar17;
        lVar26 = (long)(int)(uVar19 * uVar34) + (long)pvVar25;
        local_228 = (long)(int)((uVar34 | 1) * uVar19) + (long)pvVar25;
        local_290 = (long)(int)((uVar34 | 2) * uVar19) + (long)pvVar25;
        local_298 = (long)(int)((int)(uVar17 | 3) * uVar19) + (long)pvVar25;
        puVar41 = (undefined8 *)
                  ((ulong)(((uint)(uVar17 >> 3) & 1) + ((uint)(uVar17 >> 4) & 0xfffffff) +
                          (uint)((uVar34 >> 2 & 1) != 0)) * (this->weight_data_tm).cstep *
                   (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        lVar38 = (long)pvVar25 + iVar13 + local_d8;
        lVar18 = (long)pvVar25 + (int)local_264 + local_d8;
        lVar30 = (long)pvVar25 + local_260 + local_d8;
        lVar23 = (long)pvVar25 + local_25c + local_d8;
        local_220 = 0;
        local_2b8 = lVar30;
        local_2a8 = lVar23;
        local_288 = lVar18;
        local_280 = lVar38;
        for (uVar34 = 0; lVar33 = local_228, (int)(uVar34 | 0xf) < (int)_h; uVar34 = uVar34 + 0x10)
        {
          lVar33 = local_220;
          for (uVar29 = 0; uVar29 != uVar47; uVar29 = uVar29 + 1) {
            lVar39 = lVar33;
            for (lVar42 = 0; (int)lVar42 != 0x40; lVar42 = lVar42 + 8) {
              *(undefined1 *)((long)puVar41 + lVar42) =
                   *(undefined1 *)((long)pvVar25 + lVar39 + iVar13);
              *(undefined1 *)((long)puVar41 + lVar42 + 1) = *(undefined1 *)(lVar38 + lVar39);
              *(undefined1 *)((long)puVar41 + lVar42 + 2) =
                   *(undefined1 *)((long)pvVar25 + lVar39 + (int)local_264);
              *(undefined1 *)((long)puVar41 + lVar42 + 3) = *(undefined1 *)(lVar18 + lVar39);
              *(undefined1 *)((long)puVar41 + lVar42 + 4) =
                   *(undefined1 *)((long)pvVar25 + lVar39 + local_260);
              *(undefined1 *)((long)puVar41 + lVar42 + 5) = *(undefined1 *)(lVar30 + lVar39);
              *(undefined1 *)((long)puVar41 + lVar42 + 6) =
                   *(undefined1 *)((long)pvVar25 + lVar39 + local_25c);
              *(undefined1 *)((long)puVar41 + lVar42 + 7) = *(undefined1 *)(lVar23 + lVar39);
              lVar39 = lVar39 + lVar21;
            }
            puVar41 = (undefined8 *)((long)puVar41 + lVar42);
            lVar33 = lVar33 + 1;
          }
          lVar26 = lVar26 + local_140;
          local_228 = local_228 + local_140;
          local_290 = local_290 + local_140;
          local_298 = local_298 + local_140;
          local_220 = local_220 + local_140;
          local_280 = local_280 + local_140;
          local_288 = local_288 + local_140;
          local_2b8 = local_2b8 + local_140;
          local_2a8 = local_2a8 + local_140;
        }
        for (; (int)(uVar34 | 7) < (int)_h; uVar34 = uVar34 + 8) {
          lVar38 = local_298;
          lVar18 = local_2a8;
          lVar23 = lVar33;
          lVar30 = local_290;
          lVar39 = local_2b8;
          lVar42 = lVar26;
          lVar45 = local_280;
          lVar48 = local_288;
          for (uVar29 = 0; uVar29 != uVar47; uVar29 = uVar29 + 1) {
            lVar52 = 0;
            for (lVar49 = 0; (int)lVar49 != 0x20; lVar49 = lVar49 + 8) {
              *(undefined1 *)((long)puVar41 + lVar49) = *(undefined1 *)(lVar42 + lVar52);
              *(undefined1 *)((long)puVar41 + lVar49 + 1) = *(undefined1 *)(lVar45 + lVar52);
              *(undefined1 *)((long)puVar41 + lVar49 + 2) = *(undefined1 *)(lVar23 + lVar52);
              *(undefined1 *)((long)puVar41 + lVar49 + 3) = *(undefined1 *)(lVar48 + lVar52);
              *(undefined1 *)((long)puVar41 + lVar49 + 4) = *(undefined1 *)(lVar30 + lVar52);
              *(undefined1 *)((long)puVar41 + lVar49 + 5) = *(undefined1 *)(lVar39 + lVar52);
              *(undefined1 *)((long)puVar41 + lVar49 + 6) = *(undefined1 *)(lVar38 + lVar52);
              *(undefined1 *)((long)puVar41 + lVar49 + 7) = *(undefined1 *)(lVar18 + lVar52);
              lVar52 = lVar52 + lVar21;
            }
            puVar41 = (undefined8 *)((long)puVar41 + lVar49);
            lVar45 = lVar45 + 1;
            lVar42 = lVar42 + 1;
            lVar48 = lVar48 + 1;
            lVar23 = lVar23 + 1;
            lVar39 = lVar39 + 1;
            lVar30 = lVar30 + 1;
            lVar18 = lVar18 + 1;
            lVar38 = lVar38 + 1;
          }
          lVar26 = lVar26 + local_148;
          local_290 = local_290 + local_148;
          local_298 = local_298 + local_148;
          local_280 = local_280 + local_148;
          local_288 = local_288 + local_148;
          local_2b8 = local_2b8 + local_148;
          local_2a8 = local_2a8 + local_148;
          lVar33 = lVar33 + local_148;
        }
        for (; (int)(uVar34 | 1) < (int)_h; uVar34 = uVar34 + 2) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar100 = vpcmpeqd_avx2(auVar77._0_32_,auVar77._0_32_);
            vmovdqa64_avx512vl(auVar75);
            auVar100 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar100);
            auVar77 = ZEXT3264((undefined1  [32])0x0);
            auVar55 = vpmovdb_avx512vl(auVar100);
            *puVar41 = auVar55._0_8_;
            puVar41 = puVar41 + 1;
          }
        }
        for (; (int)uVar34 < (int)_h; uVar34 = uVar34 + 1) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar55 = vpcmpeqd_avx(auVar77._0_16_,auVar77._0_16_);
            auVar55 = vpgatherdd((undefined1  [16])0x0,auVar55);
            auVar77 = ZEXT1664((undefined1  [16])0x0);
            auVar55 = vpmovdb_avx512vl(auVar55);
            *(int *)puVar41 = auVar55._0_4_;
            puVar41 = (undefined8 *)((long)puVar41 + 4);
          }
        }
        local_264 = local_264 + uVar15;
        local_260 = local_260 + uVar15;
        local_25c = local_25c + uVar15;
        uVar44 = (ulong)(iVar13 + uVar15);
        local_160 = uVar17;
        local_158 = uVar22;
        uVar29 = uVar17 + 4;
      }
      auVar77 = vmovdqu64_avx512f(local_78);
      auVar95 = vpaddd_avx2(auVar95,auVar77._0_32_);
      vinserti64x4_avx512f(auVar77,auVar95,1);
      auVar55 = vpunpckldq_avx512vl(ZEXT416(uVar14),ZEXT416(uVar19 + uVar14));
      auVar77 = ZEXT1664(auVar55);
      vshufps_avx(ZEXT416(uVar19),auVar55,0x41);
      for (; (long)(uVar17 | 1) < (long)uVar20; uVar17 = uVar17 + 2) {
        pvVar25 = (this->super_Convolution).weight_data.data;
        uVar15 = (uint)uVar17;
        lVar38 = (long)(int)(uVar19 * uVar15) + (long)pvVar25;
        lVar18 = (long)(int)((int)(uVar17 | 1) * uVar19) + (long)pvVar25;
        pauVar37 = (undefined1 (*) [16])
                   ((ulong)(((uint)(uVar17 >> 2) & 1) +
                            ((uint)(uVar17 >> 4) & 0xfffffff) + (uint)((uVar15 >> 3 & 1) != 0) +
                           (uint)((uVar15 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                    (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        for (uVar15 = 0; (int)(uVar15 | 0xf) < (int)_h; uVar15 = uVar15 + 0x10) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(lVar38 + uVar29 + uVar22));
            auVar78 = vpgatherdd_avx512f(*(undefined4 *)(lVar18 + uVar29 + uVar22));
            auVar55 = vpmovdb_avx512f(auVar77);
            *pauVar37 = auVar55;
            auVar55 = vpmovdb_avx512f(auVar78);
            pauVar37[1] = auVar55;
            pauVar37 = pauVar37 + 2;
          }
          lVar38 = lVar38 + local_140;
          lVar18 = lVar18 + local_140;
        }
        for (; (int)(uVar15 | 7) < (int)_h; uVar15 = uVar15 + 8) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(lVar38 + uVar29));
            auVar55 = vpmovdb_avx512f(auVar77);
            *pauVar37 = auVar55;
            pauVar37 = pauVar37 + 1;
          }
          lVar38 = lVar38 + local_148;
          lVar18 = lVar18 + local_148;
        }
        for (; (int)(uVar15 | 1) < (int)_h; uVar15 = uVar15 + 2) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar55 = vpcmpeqd_avx(auVar77._0_16_,auVar77._0_16_);
            auVar55 = vpgatherdd((undefined1  [16])0x0,auVar55);
            auVar77 = ZEXT1664((undefined1  [16])0x0);
            auVar55 = vpmovdb_avx512vl(auVar55);
            *(int *)*pauVar37 = auVar55._0_4_;
            pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + 4);
          }
          lVar38 = lVar38 + lVar21;
          lVar18 = lVar18 + lVar21;
        }
        for (; (int)uVar15 < (int)_h; uVar15 = uVar15 + 1) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            (*pauVar37)[0] = *(undefined1 *)(lVar38 + uVar29);
            *(undefined1 *)((long)*pauVar37 + 1) = *(undefined1 *)(lVar18 + uVar29);
            pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + 2);
          }
        }
        uVar22 = (ulong)((int)uVar22 + uVar19 * 2);
      }
      vmovdqu64_avx512f(local_78);
      for (; (long)uVar17 < (long)uVar20; uVar17 = uVar17 + 1) {
        pvVar25 = (this->super_Convolution).weight_data.data;
        uVar15 = (uint)uVar17;
        lVar38 = (long)(int)(uVar19 * uVar15) + (long)pvVar25;
        pauVar37 = (undefined1 (*) [16])
                   ((ulong)((uVar15 & 1) + ((uint)(uVar17 >> 4) & 0xfffffff) +
                            (uint)((uVar15 >> 3 & 1) != 0) + ((uint)(uVar17 >> 2) & 1) +
                           (uint)((uVar15 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                    (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        lVar18 = (int)uVar22 + local_d8 + (long)pvVar25;
        for (uVar15 = 0; (int)(uVar15 | 0xf) < (int)_h; uVar15 = uVar15 + 0x10) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar77 = vpgatherdd_avx512f(*(undefined4 *)(lVar38 + uVar29 + uVar17));
            auVar55 = vpmovdb_avx512f(auVar77);
            *pauVar37 = auVar55;
            pauVar37 = pauVar37 + 1;
          }
          lVar38 = lVar38 + local_140;
          lVar18 = lVar18 + local_140;
        }
        for (; (int)(uVar15 | 7) < (int)_h; uVar15 = uVar15 + 8) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            auVar95 = vpcmpeqd_avx2(auVar77._0_32_,auVar77._0_32_);
            auVar95 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
            auVar77 = ZEXT3264((undefined1  [32])0x0);
            auVar55 = vpmovdb_avx512vl(auVar95);
            *(long *)*pauVar37 = auVar55._0_8_;
            pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + 8);
          }
          lVar38 = lVar38 + local_148;
          lVar18 = lVar18 + local_148;
        }
        for (; (int)(uVar15 | 1) < (int)_h; uVar15 = uVar15 + 2) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            (*pauVar37)[0] = *(undefined1 *)(lVar38 + uVar29);
            *(undefined1 *)((long)*pauVar37 + 1) = *(undefined1 *)(lVar18 + uVar29);
            pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + 2);
          }
          lVar38 = lVar38 + lVar21;
          lVar18 = lVar18 + lVar21;
        }
        for (; (int)uVar15 < (int)_h; uVar15 = uVar15 + 1) {
          for (uVar29 = 0; uVar47 != uVar29; uVar29 = uVar29 + 1) {
            *(undefined1 *)((long)*pauVar37 + uVar29) = *(undefined1 *)(lVar38 + uVar29);
          }
          pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + uVar29);
        }
        uVar22 = (ulong)((int)uVar22 + uVar14 * _h);
      }
      goto LAB_00179064;
    }
    iVar13 = _h * uVar14;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8
              (uVar19,0,iVar13,&TILE_M_2,&TILE_M,&TILE_N,opt->num_threads);
    iVar46 = (int)(TILE_M_2 + uVar19 + -1) / TILE_M_2;
    uVar15 = 8;
    if (opt->use_packing_layout == false) {
      uVar15 = 1;
    }
    if ((uVar29 & 7) != 0) {
      uVar15 = 1;
    }
    local_1a8.cstep = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.elemsize = 0;
    local_1a8.elempack = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.d = 0;
    local_1a8.c = 0;
    if (uVar14 == 1) {
      Mat::reshape(&m,local_138,iVar13,uVar19,(Allocator *)0x0);
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + 1;
        UNLOCK();
      }
      piVar10 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) {
            free(local_1a8.data);
          }
          else {
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1a8.data = m.data;
      local_1a8.refcount._0_4_ = SUB84(m.refcount,0);
      local_1a8.refcount._4_4_ = (undefined4)((ulong)m.refcount >> 0x20);
      local_1a8.elemsize = m.elemsize;
      local_1a8.elempack = m.elempack;
      local_1a8.allocator = m.allocator;
      local_1a8.dims = m.dims;
      local_1a8.w = m.w;
      local_1a8.h = m.h;
      local_1a8.d = m.d;
      local_1a8.c = m.c;
      local_1a8.cstep = m.cstep;
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) {
LAB_00178dcb:
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::reshape(&m,local_138,uVar14,_h,uVar19,(Allocator *)0x0);
      uVar29 = 0;
      Mat::create(&local_1a8,iVar13,uVar19,1,1,(Allocator *)0x0);
      uVar47 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar47 = uVar29;
      }
      uVar20 = 0;
      if (0 < (int)uVar19) {
        uVar20 = (ulong)uVar19;
      }
      for (; uVar29 != uVar20; uVar29 = uVar29 + 1) {
        pvVar25 = (void *)((long)local_1a8.w * uVar29 * local_1a8.elemsize + (long)local_1a8.data);
        for (lVar38 = 0; lVar38 < (long)(lVar21 - (ulong)(uVar15 - 1));
            lVar38 = lVar38 + (ulong)uVar15) {
          for (uVar44 = 0; uVar44 != uVar47; uVar44 = uVar44 + 1) {
            for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
              *(undefined1 *)((long)pvVar25 + uVar17) =
                   *(undefined1 *)
                    ((long)m.data +
                    uVar44 + (lVar38 + uVar17) * (long)m.w * m.elemsize +
                             m.cstep * uVar29 * m.elemsize);
            }
            pvVar25 = (void *)((long)pvVar25 + uVar17);
          }
        }
      }
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) goto LAB_00178dcb;
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar28 = TILE_N;
    if (TILE_N < 4) {
LAB_00178e2a:
      Mat::create(&this->weight_sgemm_data,TILE_M_2 * iVar28,(iVar13 + iVar28 + -1) / iVar28,
                  (int)((uVar19 - 1) + TILE_M_2) / TILE_M_2,1,1,(Allocator *)0x0);
    }
    else {
      iVar16 = cpu_support_x86_avx512_vnni();
      bVar12 = true;
      if (iVar16 == 0) {
        iVar16 = cpu_support_x86_avx_vnni();
        bVar12 = iVar16 != 0;
      }
      iVar16 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar12 & iVar16 == 0)) goto LAB_00178e2a;
      if (TILE_M_2 < 0x10) {
        if (TILE_M_2 < 8) {
          if (TILE_M_2 < 4) {
            iVar16 = (uint)(1 < TILE_M_2) * 4 + 4;
          }
          else {
            iVar16 = 0x10;
          }
        }
        else {
          iVar16 = 0x20;
        }
      }
      else {
        iVar16 = 0x40;
      }
      Mat::create(&this->weight_sgemm_data,(iVar16 + iVar28) * TILE_M_2,
                  (iVar13 + iVar28 + -1) / iVar28,(int)((uVar19 - 1) + TILE_M_2) / TILE_M_2,1,1,
                  (Allocator *)0x0);
    }
    iVar16 = 0;
    if (iVar46 < 1) {
      iVar46 = 0;
    }
    for (; iVar16 != iVar46; iVar16 = iVar16 + 1) {
      i_00 = TILE_M_2 * iVar16;
      max_ii = uVar19 - i_00;
      if (TILE_M_2 < (int)(uVar19 - i_00)) {
        max_ii = TILE_M_2;
      }
      for (k_11 = 0; max_kk = iVar13 - k_11, max_kk != 0 && k_11 <= iVar13; k_11 = k_11 + TILE_N) {
        if (iVar28 < max_kk) {
          max_kk = iVar28;
        }
        m.elemsize = (this->weight_sgemm_data).elemsize;
        m.w = (this->weight_sgemm_data).w;
        m.cstep = (size_t)m.w;
        m.elempack = (this->weight_sgemm_data).elempack;
        m.allocator = (this->weight_sgemm_data).allocator;
        m.data = (void *)((long)(this->weight_sgemm_data).data +
                         m.elemsize * m.cstep * (long)(k_11 / iVar28) +
                         (long)(i_00 / TILE_M_2) * (this->weight_sgemm_data).cstep * m.elemsize);
        m.refcount = (int *)0x0;
        m.dims = 2;
        m.h = 1;
        m.d = 1;
        m.c = 1;
        Gemm_x86_avx512_utility::pack_A_tile_int8(&local_1a8,&m,i_00,max_ii,k_11,max_kk);
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              free(m.data);
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar28 = TILE_N;
      }
    }
    piVar10 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (piVar10 == (int *)0x0) goto LAB_00179064;
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 != 0) goto LAB_00179064;
    if (local_1a8.allocator != (Allocator *)0x0) {
      (*(local_1a8.allocator)->_vptr_Allocator[3])();
      goto LAB_00179064;
    }
  }
  free(local_1a8.data);
LAB_00179064:
  uVar47 = 0;
  Mat::create(&this->scale_in_data,(this->super_Convolution).num_output,4,(Allocator *)0x0);
  uVar19 = (this->super_Convolution).num_output;
  pvVar25 = (this->super_Convolution).weight_data_int8_scales.data;
  pfVar8 = (float *)(this->super_Convolution).bottom_blob_int8_scales.data;
  pvVar9 = (this->scale_in_data).data;
  uVar29 = 0;
  if (0 < (int)uVar19) {
    uVar29 = (ulong)uVar19;
  }
  for (; uVar29 != uVar47; uVar47 = uVar47 + 1) {
    fVar1 = *(float *)((long)pvVar25 + uVar47 * 4);
    fVar94 = 0.0;
    if (fVar1 != 0.0) {
      fVar94 = 1.0 / (fVar1 * *pfVar8);
    }
    *(float *)((long)pvVar9 + uVar47 * 4) = fVar94;
  }
  if (opt->lightmode != false) {
    piVar10 = (this->super_Convolution).weight_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pAVar11 = (this->super_Convolution).weight_data.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          free((this->super_Convolution).weight_data.data);
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&local_138->refcount + 4) = 0;
    *(undefined8 *)((long)&local_138->elemsize + 4) = 0;
    local_138->data = (void *)0x0;
    local_138->refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution)
            conv3x3s1_winograd43_transform_kernel_int8(weight_data, weight_winograd43_data, num_input, num_output, opt);
        else
            conv3x3s1_winograd23_transform_kernel_int8(weight_data, weight_winograd23_data, num_input, num_output, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        convolution_im2col_gemm_transform_kernel_int8(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);
    }
    else
    {
        convolution_transform_kernel_packed_int8(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}